

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O2

void __thiscall pstore::command_line::option::~option(option *this)

{
  this->_vptr_option = (_func_int **)&PTR__option_0013ac28;
  all_abi_cxx11_();
  std::__cxx11::
  list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::erase
            (&all[abi:cxx11]()::all_options_abi_cxx11_,(this->container_pos_)._M_node);
  std::__cxx11::string::~string((string *)&this->description_);
  std::__cxx11::string::~string((string *)&this->usage_);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

option::~option () {
                // Remove this option from the global container.
                options_container & all = option::all ();
                all.erase (container_pos_);
            }